

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex.h
# Opt level: O0

void __thiscall
Gudhi::cubical_complex::
Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
initialize_filtration
          (Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
           *this)

{
  size_type __new_size;
  is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> local_38;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_28;
  unsigned_long *local_20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_18;
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *local_10;
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *this_local;
  
  local_10 = this;
  __new_size = std::vector<double,_std::allocator<double>_>::size
                         (&(this->super_Bitmap_cubical_complex_base<double>).data);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->sorted_cells,__new_size)
  ;
  local_18._M_current =
       (unsigned_long *)
       std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>(&this->sorted_cells);
  local_20 = (unsigned_long *)
             std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>(&this->sorted_cells)
  ;
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            (local_18,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )local_20,0);
  local_28._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->sorted_cells);
  local_30._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->sorted_cells);
  is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  is_before_in_filtration(&local_38,this);
  tbb::detail::d1::
  parallel_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Gudhi::cubical_complex::is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>>>
            (local_28,local_30,&local_38);
  return;
}

Assistant:

void Bitmap_cubical_complex<T>::initialize_filtration() {
#ifdef DEBUG_TRACES
  std::clog << "void Bitmap_cubical_complex<T>::initialize_elements_ordered_according_to_filtration() \n";
#endif
  this->sorted_cells.resize(this->data.size());
  std::iota(std::begin(sorted_cells), std::end(sorted_cells), 0);
#ifdef GUDHI_USE_TBB
  tbb::parallel_sort(sorted_cells.begin(), sorted_cells.end(),
                     is_before_in_filtration<T>(this));
#else
  std::sort(sorted_cells.begin(), sorted_cells.end(), is_before_in_filtration<T>(this));
#endif
}